

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O3

void __thiscall
persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
compute_higher_persistence
          (persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
           *this,unsigned_short min_dimension,unsigned_short max_dimension)

{
  ulong uVar1;
  iterator *piVar2;
  directed_flag_complex_computer_t *pdVar3;
  pair<float,_int> *ppVar4;
  iterator __position;
  int iVar5;
  ulong uVar6;
  filtered_directed_graph_t *pfVar7;
  vector<float,_std::allocator<float>_> *pvVar8;
  ostream *poVar9;
  pair<int,_int> pVar10;
  long lVar11;
  undefined6 in_register_00000012;
  long lVar12;
  unsigned_long uVar13;
  ulong uVar14;
  ulong uVar15;
  int dimension;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  long *plVar20;
  bool bVar21;
  pivot_column_index_t pivot_column_index;
  unsigned_long local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_90;
  deque<filtration_index_t,_std::allocator<filtration_index_t>_> *local_88;
  _Deque_base<int,_std::allocator<int>_> local_80;
  
  if ((int)CONCAT62(in_register_00000012,max_dimension) != 0) {
    uVar14 = (ulong)min_dimension;
    local_88 = &this->columns_to_reduce;
    local_90 = &this->betti_numbers;
    uVar16 = 1;
    do {
      dimension = (int)uVar16;
      directed_flag_complex_computer::directed_flag_complex_computer_t::prepare_next_dimension
                (this->complex,dimension);
      uVar1 = uVar16 + 1;
      if ((uVar1 == uVar14) &&
         (uVar18 = (uint)(this->complex->cell_count).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar16], 0 < (int)uVar18)) {
        lVar12 = 0;
        uVar15 = 0;
        do {
          pdVar3 = this->complex;
          if (pdVar3->filtration_algorithm == (filtration_algorithm_t *)0x0) {
            uVar6 = 0;
          }
          else {
            if (dimension == 1) {
              pfVar7 = pdVar3->graph;
              lVar11 = 0xc0;
LAB_00142e5e:
              pvVar8 = (vector<float,_std::allocator<float>_> *)
                       ((long)&(pfVar7->super_directed_graph_t).number_of_vertices + lVar11);
            }
            else {
              if (dimension == 0) {
                pfVar7 = pdVar3->graph;
                lVar11 = 0xa8;
                goto LAB_00142e5e;
              }
              pvVar8 = &pdVar3->next_filtration;
            }
            uVar6 = (ulong)(uint)(pvVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                 .super__Vector_impl_data._M_start[uVar15];
          }
          local_80._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)(uVar6 + lVar12);
          ppVar4 = &((this->columns_to_reduce).
                     super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_cur)->super_pair<float,_int>;
          if (ppVar4 == &(this->columns_to_reduce).
                         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                         _M_impl.super__Deque_impl_data._M_finish._M_last[-1].super_pair<float,_int>
             ) {
            std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::
            _M_push_back_aux<filtration_index_t>(local_88,(filtration_index_t *)&local_80);
          }
          else {
            *ppVar4 = (pair<float,_int>)local_80._M_impl.super__Deque_impl_data._M_map;
            piVar2 = &(this->columns_to_reduce).
                      super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                      _M_impl.super__Deque_impl_data._M_finish;
            piVar2->_M_cur = piVar2->_M_cur + 1;
          }
          uVar15 = uVar15 + 1;
          lVar12 = lVar12 + 0x100000000;
        } while ((uVar18 & 0x7fffffff) != uVar15);
      }
      if (uVar14 <= uVar1) {
        (*this->output->_vptr_output_t[5])(this->output,uVar16 & 0xffff);
        sort_columns(this);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"computing persistent homology in dimension ",0x2b);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        poVar9 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\r",1);
        std::deque<int,_std::allocator<int>_>::deque
                  ((deque<int,_std::allocator<int>_> *)&local_80,
                   (this->complex->cell_count).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar1],&INVALID_INDEX,
                   (allocator_type *)&local_98);
        pVar10 = compute_pairs(this,dimension,(pivot_column_index_t *)&local_80,uVar14 <= uVar16);
        iVar17 = pVar10.second;
        if (uVar16 < uVar14) {
          if (((uVar16 == min_dimension - 1) && (this->print_betti_numbers_to_console == true)) &&
             (this->max_entries != 0xffffffffffffffff)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"# Skipped columns in dimension ",0x1f);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
            plVar20 = (long *)std::ostream::operator<<(poVar9,iVar17);
            std::ios::widen((char)*(undefined8 *)(*plVar20 + -0x18) + (char)plVar20);
            goto LAB_0014314e;
          }
        }
        else {
          iVar19 = pVar10.first;
          uVar13 = (unsigned_long)iVar19;
          __position._M_current =
               (this->betti_numbers).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_98 = uVar13;
          if (__position._M_current ==
              (this->betti_numbers).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(local_90,__position,&local_98);
          }
          else {
            *__position._M_current = uVar13;
            (this->betti_numbers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          (*this->output->_vptr_output_t[9])(this->output,uVar13,(long)pVar10 >> 0x20);
          iVar5 = -iVar19;
          if ((uVar16 & 1) == 0) {
            iVar5 = iVar19;
          }
          this->euler_characteristic = this->euler_characteristic + iVar5;
          if (this->print_betti_numbers_to_console == true) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dim H_",6);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
            std::ostream::operator<<(poVar9,iVar19);
            if (iVar17 != 0 && -1 < (long)pVar10) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," (skipped ",10);
              poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar17);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
            plVar20 = &std::cout;
LAB_0014314e:
            std::ostream::put((char)plVar20);
            std::ostream::flush();
          }
        }
        if (uVar16 < max_dimension) {
          assemble_columns_to_reduce(this,dimension,(pivot_column_index_t *)&local_80);
        }
        if (this->complex->_is_top_dimension == true) {
          (*this->output->_vptr_output_t[10])();
          std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
          return;
        }
        std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
      }
      bVar21 = uVar16 != max_dimension;
      uVar16 = uVar1;
    } while (bVar21);
  }
  return;
}

Assistant:

void compute_higher_persistence(unsigned short min_dimension, unsigned short max_dimension) {
		for (auto dimension = 1u; dimension <= max_dimension; ++dimension) {
			complex.prepare_next_dimension(dimension);

			if (dimension + 1 == min_dimension) {
				// Here we need to reduce *all* cells because we did not compute anything of smaller dimension
				index_t number_of_cells = index_t(complex.number_of_cells(dimension));
				for (index_t index = 0; index < number_of_cells; index++) {
					columns_to_reduce.push_back(std::make_pair(complex.filtration(dimension, index), index));
				}
			}

			if (dimension + 1 < min_dimension) continue;

			output->computing_barcodes_in_dimension(dimension);

			sort_columns();

#ifdef INDICATE_PROGRESS
			std::cout << "\033[K"
			          << "computing persistent homology in dimension " << dimension << std::flush << "\r";
#endif
#ifdef USE_ARRAY_HASHMAP
			pivot_column_index_t pivot_column_index(complex.number_of_cells(dimension + 1), INVALID_INDEX);
#else
			pivot_column_index_t pivot_column_index;
			pivot_column_index.reserve(complex.number_of_cells(dimension + 1));
#endif

			auto betti = compute_pairs(dimension, pivot_column_index, dimension >= min_dimension);
			if (dimension >= min_dimension) {
				complex.computation_result(dimension, betti.first, betti.second);
#ifdef RETRIEVE_PERSISTENCE
				betti_numbers.push_back(betti.first);
#endif
				output->betti_number(betti.first, betti.second);
				euler_characteristic += (dimension & 1 ? -1 : 1) * betti.first;

				if (print_betti_numbers_to_console) {
					std::cout << "\033[K"
					          << "dim H_" << dimension << " = " << betti.first;
					if (betti.second > 0) { std::cout << " (skipped " << betti.second << ")"; }
					std::cout << std::endl;
				}
			} else if (int(dimension) == min_dimension - 1 && print_betti_numbers_to_console &&
			           max_entries < std::numeric_limits<size_t>::max()) {
				std::cout << "\033[K"
				          << "# Skipped columns in dimension " << dimension << ": " << betti.second << std::endl;
			}
			if (dimension < max_dimension) assemble_columns_to_reduce(dimension, pivot_column_index);

			// Stop early
			if (complex.is_top_dimension()) {
				output->remaining_homology_is_trivial();
				break;
			}
		}
	}